

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O1

int * f3_get_stem_contributions_d0
                (vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  int *piVar1;
  long lVar2;
  int *piVar3;
  vrna_fc_type_e vVar4;
  uint j;
  vrna_param_t *pvVar5;
  code *pcVar6;
  code *pcVar7;
  uchar uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  void *pvVar13;
  long lVar14;
  void *__ptr;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  undefined4 in_register_00000034;
  int iVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  char *pcVar25;
  char **local_90;
  
  vVar4 = fc->type;
  if (vVar4 == VRNA_FC_TYPE_SINGLE) {
    local_90 = fc->ptype_local;
  }
  else {
    local_90 = (char **)0x0;
  }
  lVar22 = (long)i;
  if (vVar4 == VRNA_FC_TYPE_SINGLE) {
    uVar18 = 1;
  }
  else {
    uVar18 = (ulong)(fc->field_23).field_1.n_seq;
  }
  pvVar5 = fc->params;
  lVar20 = *(long *)((fc->matrices->field_2).field_0.c + lVar22 * 2);
  j = fc->length;
  lVar16 = (long)(int)j;
  iVar12 = fc->window_size;
  if (vVar4 == VRNA_FC_TYPE_SINGLE) {
    pcVar25 = (char *)0x0;
  }
  else {
    pcVar25 = (fc->field_23).field_0.ptype_pf_compat;
  }
  lVar17 = lVar20 + lVar22 * -4;
  iVar21 = (pvVar5->model_details).min_loop_size;
  pvVar13 = vrna_alloc(iVar12 * 4 + 0x18);
  piVar1 = (int *)((long)pvVar13 + lVar22 * -4);
  pcVar6 = (code *)sc_wrapper->red_stem;
  pcVar7 = (code *)sc_wrapper->decomp_stem;
  uVar19 = iVar12 + i;
  uVar11 = j - 1;
  if (uVar19 <= j - 1) {
    uVar11 = uVar19;
  }
  iVar12 = (int)uVar18;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    __ptr = vrna_alloc(iVar12 * 2);
    if (iVar12 != 0) {
      uVar24 = 0;
      do {
        *(undefined2 *)((long)__ptr + uVar24 * 2) =
             *(undefined2 *)(*(long *)(pcVar25 + uVar24 * 8) + lVar22 * 2);
        uVar24 = uVar24 + 1;
      } while (uVar18 != uVar24);
    }
    if (i + iVar21 < (int)uVar11) {
      lVar20 = (long)(i + iVar21);
      do {
        lVar23 = lVar20 + 1;
        piVar1[lVar20 + 1] = 10000000;
        if ((*(int *)(lVar17 + 4 + lVar20 * 4) != 10000000) &&
           (uVar8 = (*evaluate)(i,j,(int)lVar23,(int)lVar20 + 2,'\x10',hc_dat_local), uVar8 != '\0')
           ) {
          iVar9 = *(int *)(lVar17 + lVar23 * 4);
          if (iVar12 != 0) {
            uVar24 = 0;
            do {
              uVar10 = vrna_get_ptype_md((int)*(short *)((long)__ptr + uVar24 * 2),
                                         (int)*(short *)(*(long *)(pcVar25 + uVar24 * 8) +
                                                        lVar23 * 2),&pvVar5->model_details);
              iVar15 = 0;
              if (2 < uVar10) {
                iVar15 = pvVar5->TerminalAU;
              }
              iVar9 = iVar9 + iVar15;
              uVar24 = uVar24 + 1;
            } while (uVar18 != uVar24);
          }
          piVar1[lVar23] = iVar9;
        }
        lVar20 = lVar23;
      } while (lVar23 < (int)uVar11);
    }
  }
  else if (fc->type == VRNA_FC_TYPE_SINGLE) {
    iVar9 = i + iVar21;
    if (iVar9 < (int)uVar11) {
      lVar14 = (long)iVar9 * 4 + lVar22 * -4;
      lVar23 = lVar14 + 4;
      lVar20 = lVar20 + lVar14 + 4;
      __ptr = (void *)0x0;
      lVar14 = 0;
      do {
        *(undefined4 *)((long)pvVar13 + lVar14 * 4 + lVar23) = 10000000;
        if (*(int *)(lVar20 + lVar14 * 4) != 10000000) {
          iVar15 = (int)lVar14;
          uVar8 = (*evaluate)(i,j,iVar9 + iVar15 + 1,iVar9 + 2 + iVar15,'\x10',hc_dat_local);
          if (uVar8 != '\0') {
            uVar10 = vrna_get_ptype_window(i,iVar9 + iVar15 + 1,local_90);
            iVar15 = 0;
            if (2 < uVar10) {
              iVar15 = pvVar5->TerminalAU;
            }
            *(int *)((long)pvVar13 + lVar14 * 4 + lVar23) = iVar15 + *(int *)(lVar20 + lVar14 * 4);
          }
        }
        lVar2 = lVar14 + iVar9;
        lVar14 = lVar14 + 1;
      } while (lVar2 + 1 < (long)(int)uVar11);
    }
    else {
      __ptr = (void *)0x0;
    }
  }
  else {
    __ptr = (void *)0x0;
  }
  if ((pcVar7 != (code *)0x0) && (i + iVar21 < (int)uVar11)) {
    lVar20 = (long)(i + iVar21);
    iVar21 = iVar21 + i + 2;
    lVar22 = lVar22 * -4 + 4;
    do {
      if (*(int *)((long)pvVar13 + lVar20 * 4 + lVar22) != 10000000) {
        iVar9 = (*pcVar7)(CONCAT44(in_register_00000034,i),iVar21 + -1,iVar21,sc_wrapper);
        piVar3 = (int *)((long)pvVar13 + lVar20 * 4 + lVar22);
        *piVar3 = *piVar3 + iVar9;
      }
      lVar20 = lVar20 + 1;
      iVar21 = iVar21 + 1;
    } while (lVar20 < (int)uVar11);
  }
  if (uVar19 < j) {
    piVar1[(long)(int)uVar19 + 1] = 10000000;
  }
  else {
    piVar1[lVar16] = 10000000;
    if ((*(int *)(lVar17 + lVar16 * 4) != 10000000) &&
       (uVar8 = (*evaluate)(i,j,i,j,'\x0e',hc_dat_local), uVar8 != '\0')) {
      iVar21 = *(int *)(lVar17 + lVar16 * 4);
      if (fc->type == VRNA_FC_TYPE_SINGLE) {
        uVar11 = vrna_get_ptype_window(i,j,local_90);
        iVar12 = 0;
        if (2 < uVar11) {
          iVar12 = pvVar5->TerminalAU;
        }
        iVar21 = iVar21 + iVar12;
      }
      else if ((fc->type == VRNA_FC_TYPE_COMPARATIVE) && (iVar12 != 0)) {
        uVar24 = 0;
        do {
          uVar11 = vrna_get_ptype_md((int)*(short *)((long)__ptr + uVar24 * 2),
                                     (int)*(short *)(*(long *)(pcVar25 + uVar24 * 8) + lVar16 * 2),
                                     &pvVar5->model_details);
          iVar12 = 0;
          if (2 < uVar11) {
            iVar12 = pvVar5->TerminalAU;
          }
          iVar21 = iVar21 + iVar12;
          uVar24 = uVar24 + 1;
        } while (uVar18 != uVar24);
      }
      if (pcVar6 != (code *)0x0) {
        iVar12 = (*pcVar6)(CONCAT44(in_register_00000034,i),i,j,sc_wrapper);
        iVar21 = iVar21 + iVar12;
      }
      piVar1[lVar16] = iVar21;
    }
  }
  free(__ptr);
  return piVar1;
}

Assistant:

int *
f3_get_stem_contributions_d0(vrna_fold_compound_t       *fc,
                             int                        i,
                             vrna_callback_hc_evaluate  *evaluate,
                             struct default_data        *hc_dat_local,
                             struct sc_wrapper_f3       *sc_wrapper)
{
  char                    **ptype;
  short                   **S, *si;
  unsigned int            s, n_seq, type, length;
  int                     energy, j, max_j, turn, *c, *stems, maxdist;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f3_split_in_ext_stem *sc_spl_stem;
  sc_f3_reduce_to_stem    *sc_red_stem;

  length  = fc->length;
  maxdist = fc->window_size;
  P       = fc->params;
  md      = &(P->model_details);
  c       = fc->matrices->c_local[i];
  c       -= i;
  turn    = md->min_loop_size;
  si      = NULL;
  ptype   = (fc->type == VRNA_FC_TYPE_SINGLE) ? fc->ptype_local : NULL;
  n_seq   = (fc->type == VRNA_FC_TYPE_SINGLE) ? 1 : fc->n_seq;
  S       = (fc->type == VRNA_FC_TYPE_SINGLE) ? NULL : fc->S;

  stems = (int *)vrna_alloc(sizeof(int) * (maxdist + 6));
  stems -= i;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  max_j = MIN2(length - 1, i + maxdist);

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          type      = vrna_get_ptype_window(i, j, ptype);
          stems[j]  = c[j] +
                      vrna_E_ext_stem(type, -1, -1, P);
        }
      }
      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      si = (short *)vrna_alloc(sizeof(short) * n_seq);

      for (s = 0; s < n_seq; s++)
        si[s] = S[s][i];

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          energy = c[j];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j], md);
            energy  += vrna_E_ext_stem(type, -1, -1, P);
          }
          stems[j] = energy;
        }
      }
      break;
  }


  if (sc_spl_stem)
    for (j = i + turn + 1; j <= max_j; j++)
      if (stems[j] != INF)
        stems[j] += sc_spl_stem(i, j, j + 1, sc_wrapper);

  if (length <= i + maxdist) {
    j         = length;
    stems[j]  = INF;

    if ((c[j] != INF) &&
        (evaluate(i, j, i, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
      energy = c[j];

      switch (fc->type) {
        case VRNA_FC_TYPE_SINGLE:
          type    = vrna_get_ptype_window(i, j, ptype);
          energy  += vrna_E_ext_stem(type, -1, -1, P);

          break;

        case VRNA_FC_TYPE_COMPARATIVE:
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j], md);
            energy  += vrna_E_ext_stem(type, -1, -1, P);
          }

          break;
      }

      if (sc_red_stem)
        energy += sc_red_stem(i, i, j, sc_wrapper);

      stems[j] = energy;
    }
  } else {
    /*
     * make sure we do not take (i + maxdist + 1) into account when
     * decomposing for odd dangle models
     */
    stems[i + maxdist + 1] = INF;
  }

  free(si);

  return stems;
}